

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::valueToQuotedString_abi_cxx11_(char *value)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  void *this;
  undefined8 uVar6;
  char *in_RSI;
  string *in_RDI;
  ostringstream oss;
  char *c;
  size_type maxsize;
  string *result;
  char *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string local_228 [32];
  int local_208;
  char local_201;
  ostringstream local_200 [376];
  char *local_88;
  undefined1 local_79;
  long local_78;
  allocator local_69;
  string local_68 [32];
  string local_48 [55];
  allocator local_11;
  char *local_10;
  
  if (in_RSI == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_10 = in_RSI;
    pcVar3 = strpbrk(in_RSI,"\"\\\b\f\n\r\t");
    if ((pcVar3 != (char *)0x0) ||
       (bVar2 = containsControlCharacter(in_stack_fffffffffffffd78), bVar2)) {
      sVar4 = strlen(local_10);
      local_78 = sVar4 * 2 + 3;
      local_79 = 0;
      std::__cxx11::string::string((string *)in_RDI);
      std::__cxx11::string::reserve((ulong)in_RDI);
      std::__cxx11::string::operator+=((string *)in_RDI,"\"");
      for (local_88 = local_10; *local_88 != '\0'; local_88 = local_88 + 1) {
        cVar1 = *local_88;
        if (cVar1 == '\b') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\b");
        }
        else if (cVar1 == '\t') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\t");
        }
        else if (cVar1 == '\n') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\n");
        }
        else if (cVar1 == '\f') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\f");
        }
        else if (cVar1 == '\r') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\r");
        }
        else if (cVar1 == '\"') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\\"");
        }
        else if (cVar1 == '\\') {
          std::__cxx11::string::operator+=((string *)in_RDI,"\\\\");
        }
        else {
          bVar2 = isControlCharacter(*local_88);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_200);
            poVar5 = std::operator<<((ostream *)local_200,"\\u");
            this = (void *)std::ostream::operator<<(poVar5,std::hex);
            uVar6 = std::ostream::operator<<(this,std::uppercase);
            local_201 = (char)std::setfill<char>('0');
            poVar5 = std::operator<<(uVar6,local_201);
            local_208 = (int)std::setw(4);
            poVar5 = std::operator<<(poVar5,(_Setw)local_208);
            std::ostream::operator<<(poVar5,(int)*local_88);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator+=((string *)in_RDI,local_228);
            std::__cxx11::string::~string(local_228);
            std::__cxx11::ostringstream::~ostringstream(local_200);
          }
          else {
            std::__cxx11::string::operator+=((string *)in_RDI,*local_88);
          }
        }
      }
      std::__cxx11::string::operator+=((string *)in_RDI,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"\"",&local_69);
      std::operator+(in_stack_fffffffffffffd88,
                     (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      std::operator+(in_stack_fffffffffffffd88,
                     (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  return in_RDI;
}

Assistant:

std::string valueToQuotedString(const char* value) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strpbrk(value, "\"\\\b\f\n\r\t") == NULL &&
      !containsControlCharacter(value))
    return std::string("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to std::string is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  std::string::size_type maxsize =
      strlen(value) * 2 + 3; // allescaped+quotes+NULL
  std::string result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  for (const char* c = value; *c != 0; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if (isControlCharacter(*c)) {
        std::ostringstream oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}